

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedIterations::Run(AdvancedIterations *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  GLuint GVar5;
  uint *puVar6;
  Vector<int,_4> local_d0;
  Vector<int,_4> local_c0;
  Vector<int,_4> *local_b0;
  IVec4 *data_2;
  int i_2;
  Vector<int,_4> local_90;
  Vector<int,_4> *local_80;
  IVec4 *data_1;
  int i_1;
  Vector<int,_4> local_60;
  Vector<int,_4> *local_50;
  IVec4 *data;
  undefined1 local_40 [4];
  int i;
  IVec4 zero;
  GLuint fsh;
  GLuint sh;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedIterations *this_local;
  
  glsl_fs = 
  "#version 310 es\nin ivec4 vs_in_data;\nflat out ivec4 data;\nvoid main() {\n  data = vs_in_data + 1;\n}"
  ;
  _fsh = 
  "#version 310 es\nprecision mediump float;\nflat in ivec4 data;\nout vec4 fs_out_color;\nvoid main() {\n  fs_out_color = vec4(data);\n}"
  ;
  glsl_vs = (char *)this;
  GVar5 = glu::CallLogWrapper::glCreateProgram
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  this->m_po = GVar5;
  zero.m_data[3] =
       glu::CallLogWrapper::glCreateShader
                 (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper,0x8b31);
  zero.m_data[2] =
       glu::CallLogWrapper::glCreateShader
                 (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,zero.m_data[3],1,&glsl_fs,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,zero.m_data[2],1,(GLchar **)&fsh,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,zero.m_data[3]);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,zero.m_data[2]);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po,zero.m_data[3]);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po,zero.m_data[2]);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,zero.m_data[3]);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,zero.m_data[2]);
  bVar4 = RelinkProgram(this,1);
  if (bVar4) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->m_buffer[0]);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_40,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0x10,local_40,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x10,local_40,0x88e9);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao[0]);
    glu::CallLogWrapper::glVertexAttribIFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1);
    glu::CallLogWrapper::glBindVertexBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,this->m_buffer[0],0,0x10);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao[1]);
    glu::CallLogWrapper::glVertexAttribIFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1);
    glu::CallLogWrapper::glBindVertexBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,this->m_buffer[1],0,0x10);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glBindTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8e22,this->m_xfo[0]);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,this->m_buffer[1]);
    glu::CallLogWrapper::glBindTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8e22,this->m_xfo[1]);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBindTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8e22,0);
    glu::CallLogWrapper::glEnable
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_po);
    for (data._4_4_ = 0; data._4_4_ < 10; data._4_4_ = data._4_4_ + 1) {
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vao[data._4_4_ % 2]);
      glu::CallLogWrapper::glBindTransformFeedback
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8e22,this->m_xfo[data._4_4_ % 2]);
      glu::CallLogWrapper::glBeginTransformFeedback
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      glu::CallLogWrapper::glEndTransformFeedback
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper);
    }
    local_50 = (Vector<int,_4> *)
               glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x8c8e,0,0x10,1);
    tcu::Vector<int,_4>::Vector(&local_60,local_50);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xffffffffffffff90,10);
    bVar4 = VertexAttribBindingBase::IsEqual
                      (&this->super_VertexAttribBindingBase,&local_60,
                       (IVec4 *)&stack0xffffffffffffff90);
    if (bVar4) {
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e);
      bVar4 = RelinkProgram(this,5);
      if (bVar4) {
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vao[0]);
        glu::CallLogWrapper::glDisableVertexAttribArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1);
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,0,0,0);
        glu::CallLogWrapper::glVertexAttribIFormat
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,4,0x1404,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5);
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,this->m_buffer[0],0,0x10);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vao[1]);
        glu::CallLogWrapper::glDisableVertexAttribArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1);
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,0,0,0);
        glu::CallLogWrapper::glVertexAttribIFormat
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,4,0x1404,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5);
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,7,this->m_buffer[1],0,0x10);
        glu::CallLogWrapper::glVertexAttribBinding
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,7);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        for (data_1._4_4_ = 0; data_1._4_4_ < 10; data_1._4_4_ = data_1._4_4_ + 1) {
          glu::CallLogWrapper::glBindVertexArray
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,this->m_vao[data_1._4_4_ % 2]);
          glu::CallLogWrapper::glBindTransformFeedback
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8e22,this->m_xfo[data_1._4_4_ % 2]);
          glu::CallLogWrapper::glBeginTransformFeedback
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0);
          glu::CallLogWrapper::glDrawArrays
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0,1);
          glu::CallLogWrapper::glEndTransformFeedback
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
        }
        local_80 = (Vector<int,_4> *)
                   glu::CallLogWrapper::glMapBufferRange
                             (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,0x8c8e,0,0x10,1);
        tcu::Vector<int,_4>::Vector(&local_90,local_80);
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xffffffffffffff60,0x14);
        bVar4 = VertexAttribBindingBase::IsEqual
                          (&this->super_VertexAttribBindingBase,&local_90,
                           (IVec4 *)&stack0xffffffffffffff60);
        if (bVar4) {
          glu::CallLogWrapper::glUnmapBuffer
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8c8e);
          bVar4 = RelinkProgram(this,0xb);
          if (bVar4) {
            glu::CallLogWrapper::glBindTransformFeedback
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8e22,0);
            glu::CallLogWrapper::glBindVertexArray
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,this->m_vao[0]);
            glu::CallLogWrapper::glDisableVertexAttribArray
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,5);
            glu::CallLogWrapper::glBindVertexBuffer
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,5,0,0,0);
            glu::CallLogWrapper::glVertexAttribIFormat
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0xb,4,0x1404,0);
            glu::CallLogWrapper::glEnableVertexAttribArray
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0xb);
            for (data_2._4_4_ = 0; data_2._4_4_ < 10; data_2._4_4_ = data_2._4_4_ + 1) {
              glu::CallLogWrapper::glBindVertexBuffer
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0xb,this->m_buffer[data_2._4_4_ % 2],0,0x10);
              glu::CallLogWrapper::glBindBufferBase
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8c8e,0,this->m_buffer[(data_2._4_4_ + 1) % 2]);
              glu::CallLogWrapper::glBeginTransformFeedback
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0);
              glu::CallLogWrapper::glDrawArrays
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0,0,1);
              glu::CallLogWrapper::glEndTransformFeedback
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
            }
            local_b0 = (Vector<int,_4> *)
                       glu::CallLogWrapper::glMapBufferRange
                                 (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                   super_GLWrapper.super_CallLogWrapper,0x8c8e,0,0x10,1);
            tcu::Vector<int,_4>::Vector(&local_c0,local_b0);
            tcu::Vector<int,_4>::Vector(&local_d0,0x1e);
            bVar4 = VertexAttribBindingBase::IsEqual
                              (&this->super_VertexAttribBindingBase,&local_c0,&local_d0);
            if (bVar4) {
              this_local = (AdvancedIterations *)0x0;
            }
            else {
              puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_b0,0);
              uVar1 = *puVar6;
              puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_b0,1);
              uVar2 = *puVar6;
              puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_b0,2);
              uVar3 = *puVar6;
              puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_b0,3);
              anon_unknown_0::Output
                        ("Data is: %d %d %d %d, data should be: 30 30 30 30.\n",(ulong)uVar1,
                         (ulong)uVar2,(ulong)uVar3,(ulong)*puVar6);
              this_local = (AdvancedIterations *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (AdvancedIterations *)&DAT_ffffffffffffffff;
          }
        }
        else {
          puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_80,0);
          uVar1 = *puVar6;
          puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_80,1);
          uVar2 = *puVar6;
          puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_80,2);
          uVar3 = *puVar6;
          puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_80,3);
          anon_unknown_0::Output
                    ("Data is: %d %d %d %d, data should be: 20 20 20 20.\n",(ulong)uVar1,
                     (ulong)uVar2,(ulong)uVar3,(ulong)*puVar6);
          this_local = (AdvancedIterations *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedIterations *)&DAT_ffffffffffffffff;
      }
    }
    else {
      puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_50,0);
      uVar1 = *puVar6;
      puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_50,1);
      uVar2 = *puVar6;
      puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_50,2);
      uVar3 = *puVar6;
      puVar6 = (uint *)tcu::Vector<int,_4>::operator[](local_50,3);
      anon_unknown_0::Output
                ("Data is: %d %d %d %d, data should be: 10 10 10 10.\n",(ulong)uVar1,(ulong)uVar2,
                 (ulong)uVar3,(ulong)*puVar6);
      this_local = (AdvancedIterations *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedIterations *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 310 es" NL "in ivec4 vs_in_data;" NL "flat out ivec4 data;" NL
									"void main() {" NL "  data = vs_in_data + 1;" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "precision mediump float;" NL "flat in ivec4 data;" NL "out vec4 fs_out_color;" NL
			"void main() {" NL "  fs_out_color = vec4(data);" NL "}";
		m_po = glCreateProgram();
		/* attach shader */
		{
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_po, sh);
			glAttachShader(m_po, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
		}
		if (!RelinkProgram(1))
			return ERROR;

		glBindBuffer(GL_ARRAY_BUFFER, m_buffer[0]);
		IVec4 zero(0);
		glBufferData(GL_ARRAY_BUFFER, 16, &zero, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, &zero, GL_DYNAMIC_READ);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[1], 0, 16);
		glBindVertexArray(0);

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[1]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[1]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[0]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(10)))
			{
				Output("Data is: %d %d %d %d, data should be: 10 10 10 10.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
			glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		}

		if (!RelinkProgram(5))
			return ERROR;
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(5, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(7, m_buffer[1], 0, 16);
		glVertexAttribBinding(5, 7);
		glBindVertexArray(0);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(20)))
			{
				Output("Data is: %d %d %d %d, data should be: 20 20 20 20.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
			glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		}

		if (!RelinkProgram(11))
			return ERROR;
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(5);
		glBindVertexBuffer(5, 0, 0, 0);
		glVertexAttribIFormat(11, 4, GL_INT, 0);
		glEnableVertexAttribArray(11);
		for (int i = 0; i < 10; ++i)
		{
			glBindVertexBuffer(11, m_buffer[i % 2], 0, 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[(i + 1) % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(30)))
			{
				Output("Data is: %d %d %d %d, data should be: 30 30 30 30.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
		}

		return NO_ERROR;
	}